

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bucket.h
# Opt level: O0

EdgeIterator * __thiscall dg::vr::Bucket::EdgeIterator::operator++(EdgeIterator *this)

{
  reference __src;
  Bucket *__args;
  EdgeIterator *in_RDI;
  Bucket *to;
  DirectRelIterator current;
  vector<dg::vr::Bucket::DirectRelIterator,_std::allocator<dg::vr::Bucket::DirectRelIterator>_>
  *in_stack_ffffffffffffffd0;
  
  __src = std::
          vector<dg::vr::Bucket::DirectRelIterator,_std::allocator<dg::vr::Bucket::DirectRelIterator>_>
          ::back((vector<dg::vr::Bucket::DirectRelIterator,_std::allocator<dg::vr::Bucket::DirectRelIterator>_>
                  *)in_RDI);
  memcpy(&stack0xffffffffffffffd0,__src,0x28);
  std::vector<dg::vr::Bucket::DirectRelIterator,_std::allocator<dg::vr::Bucket::DirectRelIterator>_>
  ::pop_back((vector<dg::vr::Bucket::DirectRelIterator,_std::allocator<dg::vr::Bucket::DirectRelIterator>_>
              *)0x1e076c);
  DirectRelIterator::operator->((DirectRelIterator *)&stack0xffffffffffffffd0);
  __args = RelationEdge::to((RelationEdge *)0x1e077e);
  DirectRelIterator::inc((DirectRelIterator *)in_RDI);
  std::vector<dg::vr::Bucket::DirectRelIterator,std::allocator<dg::vr::Bucket::DirectRelIterator>>::
  emplace_back<dg::vr::Bucket::DirectRelIterator&>
            (in_stack_ffffffffffffffd0,(DirectRelIterator *)__args);
  std::vector<dg::vr::Bucket::DirectRelIterator,std::allocator<dg::vr::Bucket::DirectRelIterator>>::
  emplace_back<dg::vr::Bucket_const&>(in_stack_ffffffffffffffd0,__args);
  nextViableEdge(in_RDI);
  return in_RDI;
}

Assistant:

EdgeIterator &operator++() {
            DirectRelIterator current = stack.back();
            stack.pop_back();

            const Bucket &to = current->to();

            // plan return to next successor of "from" bucket
            current.inc(); // dont use ++, because incoming relation is needed
                           // on the stack
            stack.emplace_back(current);

            // plan visit to first successor of "to" bucket if unexplored so far
            stack.emplace_back(to);
            nextViableEdge();

            return *this;
        }